

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckVisibilityRulesVisit
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto,
          VisibilityCheckerState *state)

{
  bool bVar1;
  Descriptor *pDVar2;
  value_type local_48;
  value_type local_38;
  VisibilityCheckerState *local_28;
  VisibilityCheckerState *state_local;
  EnumDescriptorProto *proto_local;
  EnumDescriptor *enm_local;
  DescriptorBuilder *this_local;
  
  local_28 = state;
  state_local = (VisibilityCheckerState *)proto;
  proto_local = (EnumDescriptorProto *)enm;
  enm_local = (EnumDescriptor *)this;
  pDVar2 = EnumDescriptor::containing_type(enm);
  if (pDVar2 != (Descriptor *)0x0) {
    bVar1 = IsEnumNamespaceMessage(this,(EnumDescriptor *)proto_local);
    if (bVar1) {
      local_38.descriptor = (EnumDescriptor *)proto_local;
      local_38.proto = (EnumDescriptorProto *)state_local;
      std::
      vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
      ::push_back(&local_28->namespaced_enums,&local_38);
    }
    else {
      local_48.descriptor = (EnumDescriptor *)proto_local;
      local_48.proto = (EnumDescriptorProto *)state_local;
      std::
      vector<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto,_std::allocator<google::protobuf::DescriptorBuilder::EnumDescriptorAndProto>_>
      ::push_back(&local_28->nested_enums,&local_48);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckVisibilityRulesVisit(
    const EnumDescriptor& enm, const EnumDescriptorProto& proto,
    VisibilityCheckerState& state) {
  if (enm.containing_type() != nullptr) {
    if (IsEnumNamespaceMessage(enm)) {
      state.namespaced_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    } else {
      state.nested_enums.push_back(EnumDescriptorAndProto{&enm, &proto});
    }
  }
}